

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlHandle __thiscall TiXmlHandle::Child(TiXmlHandle *this,char *value,int count)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  TiXmlNode *pTVar3;
  bool bVar4;
  
  if (*(long *)value != 0) {
    for (pTVar3 = *(TiXmlNode **)(*(long *)value + 0x28); pTVar3 != (TiXmlNode *)0x0;
        pTVar3 = pTVar3->next) {
      iVar1 = strcmp(((pTVar3->value).rep_)->str,(char *)CONCAT44(in_register_00000014,count));
      if (iVar1 == 0) goto LAB_00181bb4;
    }
    pTVar3 = (TiXmlNode *)0x0;
LAB_00181bb4:
    bVar4 = pTVar3 != (TiXmlNode *)0x0;
    if (0 < in_ECX && bVar4) {
      iVar1 = 0;
LAB_00181bc9:
      do {
        pTVar3 = pTVar3->next;
        if (pTVar3 == (TiXmlNode *)0x0) {
          pTVar3 = (TiXmlNode *)0x0;
        }
        else {
          iVar2 = strcmp(((pTVar3->value).rep_)->str,(char *)CONCAT44(in_register_00000014,count));
          if (iVar2 != 0) goto LAB_00181bc9;
        }
        bVar4 = pTVar3 != (TiXmlNode *)0x0;
        if ((pTVar3 == (TiXmlNode *)0x0) || (iVar1 = iVar1 + 1, in_ECX <= iVar1)) break;
      } while( true );
    }
    if (bVar4) goto LAB_00181c02;
  }
  pTVar3 = (TiXmlNode *)0x0;
LAB_00181c02:
  this->node = pTVar3;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::Child( const char* value, int count ) const
{
	if ( node )
	{
		int i;
		TiXmlNode* child = node->FirstChild( value );
		for (	i=0;
				child && i<count;
				child = child->NextSibling( value ), ++i )
		{
			// nothing
		}
		if ( child )
			return TiXmlHandle( child );
	}
	return TiXmlHandle( 0 );
}